

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_class.h
# Opt level: O0

uint small_class_calc_offset_by_size(small_class *sc,uint size)

{
  uint uVar1;
  uint local_30;
  uint log2_part;
  uint linear_part;
  uint log2;
  uint checked_size;
  uint size_local;
  small_class *sc_local;
  
  local_30 = size - sc->size_shift_plus_1;
  if (size < local_30) {
    local_30 = 0;
  }
  sc_local._4_4_ = local_30 >> ((byte)sc->ignore_bits_count & 0x1f);
  if (sc->effective_size <= sc_local._4_4_) {
    uVar1 = small_class_fls(sc_local._4_4_ >> ((byte)sc->effective_bits & 0x1f));
    sc_local._4_4_ =
         (sc_local._4_4_ >> ((byte)uVar1 & 0x1f)) + (uVar1 << ((byte)sc->effective_bits & 0x1f));
  }
  return sc_local._4_4_;
}

Assistant:

static inline unsigned
small_class_calc_offset_by_size(struct small_class *sc, unsigned size)
{
	/*
	 * Usually we have to decrement size in order to:
	 * 1)make zero base class.
	 * 2)round up to class size.
	 * Also here is a good place to shift size if a user wants the lowest
	 * class size to be different from granularity.
	 */
	unsigned checked_size = size - sc->size_shift_plus_1;
	/* Check overflow. */
	size = checked_size > size ? 0 : checked_size;
	/* Omit never significant bits. */
	size >>= sc->ignore_bits_count;
#ifndef SMALL_CLASS_BRANCHLESS
	if (size < sc->effective_size)
		return size; /* Linear approximation, faster part. */
	/* Get log2 base part of result. Effective bits are omitted. */
	unsigned log2 = small_class_fls(size >> sc->effective_bits);
#else
	/* Evaluation without branching */
	/*
	 * Get log2 base part of result. Effective bits are omitted.
	 * Also note that 1u is ORed to make log2 == 0 for smaller sizes.
	 */
	unsigned log2 = small_class_fls((size >> sc->effective_bits) | 1u);
#endif
	/* Effective bits (and leading 1?) in size, represent small steps. */
	unsigned linear_part = size >> log2;
	/* Log2 part, multiplied correspondingly, represent big steps. */
	unsigned log2_part = log2 << sc->effective_bits;
	/* Combine the result. */
	return linear_part + log2_part;
}